

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCache.cpp
# Opt level: O0

char * BinaryCache::GetBytecode(char *path)

{
  uint uVar1;
  uint uVar2;
  CodeDescriptor *pCVar3;
  uint local_20;
  uint i;
  uint hash;
  char *path_local;
  
  uVar1 = NULLC::GetStringHash(path);
  if (uVar1 == lastHash) {
    path_local = lastBytecode;
  }
  else {
    local_20 = 0;
    while ((uVar2 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::size
                              ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)cache),
           local_20 < uVar2 &&
           (pCVar3 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::operator[]
                               ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)cache,
                                local_20), uVar1 != pCVar3->nameHash))) {
      local_20 = local_20 + 1;
    }
    uVar1 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::size
                      ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)cache);
    if (local_20 == uVar1) {
      path_local = (char *)0x0;
    }
    else {
      pCVar3 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::operator[]
                         ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)cache,local_20);
      path_local = pCVar3->binary;
    }
  }
  return path_local;
}

Assistant:

const char* BinaryCache::GetBytecode(const char* path)
{
	unsigned int hash = NULLC::GetStringHash(path);
	if(hash == lastHash)
		return lastBytecode;

	unsigned int i = 0;
	for(; i < cache.size(); i++)
	{
		if(hash == cache[i].nameHash)
			break;
	}
	if(i != cache.size())
		return cache[i].binary;

	return NULL;
}